

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMateGeneric::SetupLinkMask(ChLinkMateGeneric *this)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  
  uVar1._0_1_ = this->c_x;
  uVar1._1_1_ = this->c_y;
  uVar1._2_1_ = this->c_z;
  uVar1._3_1_ = this->c_rx;
  uVar1._4_1_ = this->c_ry;
  uVar1._5_1_ = this->c_rz;
  uVar1._6_2_ = *(undefined2 *)&this->field_0x1ce;
  auVar3._0_4_ = (undefined4)uVar1;
  auVar3._4_12_ = ZEXT812(0) << 0x20;
  auVar3 = vpsadbw_avx(auVar3,ZEXT816(0) << 0x40);
  bVar2 = auVar3[0] + this->c_ry + this->c_rz;
  ChLinkMask::ResetNconstr(&this->mask,(uint)bVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>_>::setZero
            (&(this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>,(ulong)bVar2);
  ChangedLinkMask(this);
  return;
}

Assistant:

void ChLinkMateGeneric::SetupLinkMask() {
    int nc = 0;
    if (c_x)
        nc++;
    if (c_y)
        nc++;
    if (c_z)
        nc++;
    if (c_rx)
        nc++;
    if (c_ry)
        nc++;
    if (c_rz)
        nc++;

    mask.ResetNconstr(nc);

    C.setZero(nc);

    ChangedLinkMask();
}